

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

RDL_cycleIterator * RDL_getRCyclesForURFIterator(RDL_data *data,uint index)

{
  uint bcc_index_00;
  uint urf_index;
  uint bcc_index;
  uint urf_internal_index;
  RDL_cycleIterator *it;
  uint index_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    data_local = (RDL_data *)0x0;
  }
  else if (index < data->nofURFs) {
    bcc_index_00 = data->urf_to_bcc[index][0];
    urf_index = data->urf_to_bcc[index][1];
    data_local = (RDL_data *)
                 RDL_initCycleIterator
                           (RDL_URF_IT,0,0,urf_index,urf_index,bcc_index_00,bcc_index_00,'b',data);
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"invalid index: %u\n",(ulong)index);
    data_local = (RDL_data *)0x0;
  }
  return (RDL_cycleIterator *)data_local;
}

Assistant:

RDL_cycleIterator* RDL_getRCyclesForURFIterator(const RDL_data *data, unsigned index)
{
  RDL_cycleIterator* it;
  unsigned urf_internal_index, bcc_index;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return NULL;
  }

  if (index >= data->nofURFs) {
    RDL_outputFunc(RDL_ERROR, "invalid index: %u\n", index);
    return NULL;
  }

  bcc_index = data->urf_to_bcc[index][0];
  urf_internal_index = data->urf_to_bcc[index][1];

  it = RDL_initCycleIterator(
      RDL_URF_IT,
      0, 0,
      urf_internal_index, urf_internal_index,
      bcc_index, bcc_index,
      'b', data);

  return it;
}